

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testDefaultSubroutineSet
          (FunctionalTest14_15 *this,vec4<unsigned_int> *uni_input,
          vec4<unsigned_int> *expected_routine_1_result,
          vec4<unsigned_int> *expected_routine_2_result)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  uint *puVar6;
  double __x;
  double __x_00;
  vec4<unsigned_int> routine_2_result;
  vec4<unsigned_int> routine_1_result;
  MessageBuilder message;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x15c0))
            (this->m_uniform_location,uni_input->m_x,uni_input->m_y,uni_input->m_z,uni_input->m_w);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e47);
  (**(code **)(lVar5 + 0x30))(0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e4b);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e4e);
  (**(code **)(lVar5 + 0x638))();
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e51);
  puVar6 = (uint *)(**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e55);
  routine_1_result.m_x = *puVar6;
  routine_1_result.m_y = puVar6[1];
  routine_1_result.m_z = puVar6[2];
  routine_1_result.m_w = puVar6[3];
  routine_2_result.m_x = puVar6[4];
  routine_2_result.m_y = puVar6[5];
  routine_2_result.m_z = puVar6[6];
  routine_2_result.m_w = puVar6[7];
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e66);
  bVar2 = Utils::vec4<unsigned_int>::operator==(&routine_1_result,expected_routine_1_result);
  if ((bVar2) ||
     (bVar2 = Utils::vec4<unsigned_int>::operator==(&routine_1_result,expected_routine_1_result + 1)
     , bVar2)) {
    bVar2 = Utils::vec4<unsigned_int>::operator==(&routine_2_result,expected_routine_2_result);
    if (bVar2) {
      return true;
    }
    bVar2 = Utils::vec4<unsigned_int>::operator==(&routine_2_result,expected_routine_2_result + 1);
    if (bVar2) {
      return true;
    }
  }
  message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = &message.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Error. Invalid result.");
  tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = &message.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Routine_1, result: ")
  ;
  Utils::vec4<unsigned_int>::log(&routine_1_result,__x);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Routine_2, result: ")
  ;
  Utils::vec4<unsigned_int>::log(&routine_2_result,__x_00);
  tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  return false;
}

Assistant:

bool FunctionalTest14_15::testDefaultSubroutineSet(const Utils::vec4<glw::GLuint>& uni_input,
												   const Utils::vec4<glw::GLuint>  expected_routine_1_result[2],
												   const Utils::vec4<glw::GLuint>  expected_routine_2_result[2]) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Set up input data uniforms */
	gl.uniform4ui(m_uniform_location, uni_input.m_x, uni_input.m_y, uni_input.m_z, uni_input.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLuint* feedback_data = (GLuint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLuint> routine_1_result;
	Utils::vec4<GLuint> routine_2_result;

	routine_1_result.m_x = feedback_data[0 + 0];
	routine_1_result.m_y = feedback_data[0 + 1];
	routine_1_result.m_z = feedback_data[0 + 2];
	routine_1_result.m_w = feedback_data[0 + 3];

	routine_2_result.m_x = feedback_data[4 + 0];
	routine_2_result.m_y = feedback_data[4 + 1];
	routine_2_result.m_z = feedback_data[4 + 2];
	routine_2_result.m_w = feedback_data[4 + 3];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verifiy */
	result = result &&
			 ((routine_1_result == expected_routine_1_result[0]) || (routine_1_result == expected_routine_1_result[1]));

	result = result &&
			 ((routine_2_result == expected_routine_2_result[0]) || (routine_2_result == expected_routine_2_result[1]));

	/* Log error if any */
	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Routine_1, result: ";

		routine_1_result.log(message);

		message << "Routine_2, result: ";

		routine_2_result.log(message);

		message << tcu::TestLog::EndMessage;
	}

	/* Done */
	return result;
}